

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O1

bool __thiscall
HighsSplitDeque::leapfrogStolenTask(HighsSplitDeque *this,HighsTask *task,HighsSplitDeque **stealer)

{
  bool bVar1;
  ulong uVar2;
  HighsTask *task_00;
  HighsSplitDeque *pHVar3;
  
  uVar2 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  if ((uVar2 & 1) == 0) {
    if (uVar2 < 4) {
      do {
        uVar2 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
      } while ((uVar2 & 0xfffffffffffffffd) == 0);
    }
    if ((uVar2 & 1) == 0) {
      pHVar3 = (HighsSplitDeque *)(uVar2 & 0xfffffffffffffffc);
      uVar2 = (ulong)(((uint)uVar2 & 2) >> 1);
      goto LAB_0027d8c4;
    }
  }
  pHVar3 = (HighsSplitDeque *)0x0;
LAB_0027d8c4:
  *stealer = pHVar3;
  if (pHVar3 == (HighsSplitDeque *)0x0) {
    bVar1 = true;
  }
  else {
    while ((uVar2 & 1) == 0) {
      task_00 = stealWithRetryLoop(*stealer);
      if (task_00 == (HighsTask *)0x0) break;
      runStolenTask(this,task_00);
      uVar2 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
    }
    bVar1 = (bool)((byte)(task->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1);
  }
  return bVar1;
}

Assistant:

bool leapfrogStolenTask(HighsTask* task, HighsSplitDeque*& stealer) {
    bool cancelled;
    stealer = task->getStealerIfUnfinished(&cancelled);

    if (stealer == nullptr) return true;

    if (!cancelled) {
      do {
        HighsTask* t = stealer->stealWithRetryLoop();
        if (t == nullptr) break;
        runStolenTask(t);
      } while (!task->isFinished());
    }

    return task->isFinished();
  }